

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

t_operand __thiscall
xemmai::ast::t_return::f_emit(t_return *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  size_t sVar1;
  bool bVar2;
  pointer ptVar3;
  size_type sVar4;
  t_emit *this_00;
  t_operand tVar5;
  t_null local_68;
  int local_48;
  size_t local_38;
  size_t stack;
  bool a_clear_local;
  bool a_operand_local;
  t_emit *ptStack_28;
  bool a_tail_local;
  t_emit *a_emit_local;
  t_return *this_local;
  anon_union_8_4_0f1077ea_for_t_operand_2 local_10;
  
  local_38 = a_emit->v_stack;
  a_emit->v_stack = a_emit->v_targets->v_return_stack;
  stack._5_1_ = a_clear;
  stack._6_1_ = a_operand;
  stack._7_1_ = a_tail;
  ptStack_28 = a_emit;
  a_emit_local = (t_emit *)this;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->v_expression);
  if (bVar2) {
    ptVar3 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(&this->v_expression);
    local_48 = (*ptVar3->_vptr_t_node[3])
                         (ptVar3,ptStack_28,(ulong)(ptStack_28->v_targets->v_return_is_tail & 1),0);
  }
  else {
    t_null::t_node(&local_68,&(this->super_t_node).v_at);
    t_null::f_emit(&local_68,ptStack_28,(bool)(ptStack_28->v_targets->v_return_is_tail & 1),false,
                   false);
    t_null::~t_null(&local_68);
  }
  if ((ptStack_28->v_targets->v_return_is_tail & 1U) == 0) {
    t_emit::f_join(ptStack_28,ptStack_28->v_targets->v_return_junction);
    this_00 = t_emit::operator<<(ptStack_28,c_instruction__JUMP);
    t_emit::operator<<(this_00,ptStack_28->v_targets->v_return);
  }
  else {
    sVar1 = ptStack_28->v_stack;
    sVar4 = std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
            ::size(&ptStack_28->v_scope->v_privates);
    if (sVar1 != sVar4 + 1) {
      __assert_fail("a_emit.v_stack == a_emit.v_scope->v_privates.size() + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/ast.cc"
                    ,0x17c,
                    "virtual t_operand xemmai::ast::t_return::f_emit(t_emit &, bool, bool, bool)");
    }
    t_emit::operator<<(ptStack_28,c_instruction__RETURN_T);
  }
  ptStack_28->v_stack = local_38;
  if ((stack._5_1_ & 1) == 0) {
    t_emit::f_push(ptStack_28);
  }
  t_operand::t_operand((t_operand *)&this_local);
  tVar5._4_4_ = 0;
  tVar5.v_tag = (uint)this_local;
  tVar5.field_1.v_integer = local_10.v_integer;
  return tVar5;
}

Assistant:

t_operand t_return::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	auto stack = a_emit.v_stack;
	a_emit.v_stack = a_emit.v_targets->v_return_stack;
	if (v_expression)
		v_expression->f_emit(a_emit, a_emit.v_targets->v_return_is_tail, false);
	else
		t_null(v_at).f_emit(a_emit, a_emit.v_targets->v_return_is_tail, false, false);
	if (a_emit.v_targets->v_return_is_tail) {
		assert(a_emit.v_stack == a_emit.v_scope->v_privates.size() + 1);
		a_emit << c_instruction__RETURN_T;
	} else {
		a_emit.f_join(*a_emit.v_targets->v_return_junction);
		a_emit << c_instruction__JUMP << *a_emit.v_targets->v_return;
	}
	a_emit.v_stack = stack;
	if (!a_clear) a_emit.f_push();
	return {};
}